

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_test.cpp
# Opt level: O2

int main(void)

{
  XMLError XVar1;
  ostream *poVar2;
  XMLElement *pXVar3;
  XMLElement *el;
  _func_uint_void_ptr *local_540;
  XMLElement *els [2];
  XMLDocument cmds;
  XMLDocument doc;
  
  tinyxml2::XMLDocument::XMLDocument(&doc,true,PRESERVE_WHITESPACE);
  XVar1 = tinyxml2::XMLDocument::LoadFile(&doc,"/Users/tkorays/invoker/res/simple_task.xml");
  if (XVar1 == XML_NO_ERROR) {
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&doc.super_XMLNode,"proc");
    if (pXVar3 == (XMLElement *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"root node must be a proc");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      tinyxml2::XMLDocument::XMLDocument(&cmds,true,PRESERVE_WHITESPACE);
      XVar1 = tinyxml2::XMLDocument::LoadFile(&cmds,"/Users/tkorays/invoker/res/mycmds.xml");
      if (XVar1 == XML_NO_ERROR) {
        el = tinyxml2::XMLNode::FirstChildElement(&cmds.super_XMLNode,"cmds");
        if (el == (XMLElement *)0x0) {
          poVar2 = std::operator<<((ostream *)&std::cout,"root node must b a cmds");
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        else {
          ivk::proc_add_cmds(el);
          ivk::proc_install();
          local_540 = cmd_a;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
          ::pair<const_char_(&)[6],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
                      *)els,(char (*) [6])"cmd_a",&local_540);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int(*)(void*)>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
                      *)ivk::gCmdFuncMap_abi_cxx11_,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
                      *)els);
          std::__cxx11::string::~string((string *)els);
          local_540 = cmd_b;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
          ::pair<const_char_(&)[6],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
                      *)els,(char (*) [6])"cmd_b",&local_540);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int(*)(void*)>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
                      *)ivk::gCmdFuncMap_abi_cxx11_,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
                      *)els);
          std::__cxx11::string::~string((string *)els);
          local_540 = dump;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
          ::pair<const_char_(&)[5],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
                      *)els,(char (*) [5])"dump",&local_540);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int(*)(void*)>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
                      *)ivk::gCmdFuncMap_abi_cxx11_,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
                      *)els);
          std::__cxx11::string::~string((string *)els);
          els[1] = (XMLElement *)0x0;
          els[0] = pXVar3;
          ivk::proc_exec(els);
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"open file failed");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      tinyxml2::XMLDocument::~XMLDocument(&cmds);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Open File Failed");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  tinyxml2::XMLDocument::~XMLDocument(&doc);
  return 0;
}

Assistant:

int main(){
    XMLDocument doc;
    XMLError err = XML_NO_ERROR;
    err = doc.LoadFile("/Users/tkorays/invoker/res/simple_task.xml");
    if(err!=XML_NO_ERROR){
        cout<<"Open File Failed"<<endl;
        return 0;
    }

    // 任务入口
    XMLElement* e = doc.FirstChildElement("proc");
    if(e==0){
        cout<<"root node must be a proc"<<endl;
        return 0;
    }

    XMLDocument cmds;
    err = cmds.LoadFile("/Users/tkorays/invoker/res/mycmds.xml");
    if(err!=XML_NO_ERROR){
        cout<<"open file failed"<<endl;
        return 0;
    }
    XMLElement* cmd = cmds.FirstChildElement("cmds");
    if(!cmd){
        cout<<"root node must b a cmds"<<endl;
        return 0;
    }
    proc_add_cmds(cmd);


    proc_install();
    gCmdFuncMap.insert(pair<string,cmd_func>("cmd_a",cmd_a));
    gCmdFuncMap.insert(pair<string,cmd_func>("cmd_b",cmd_b));
    gCmdFuncMap.insert(pair<string,cmd_func>("dump",dump));
    XMLElement* els[2];
    els[0] = e;
    els[1] = 0;
    proc_exec(els);

    return 0;
}